

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.cpp
# Opt level: O0

void ixy::remove_driver(string *pci_addr)

{
  byte bVar1;
  long lVar2;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_2b0;
  undefined4 local_2a0;
  undefined1 local_299;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_298;
  long local_288;
  ofstream s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  path path;
  string *pci_addr_local;
  
  path._32_8_ = pci_addr;
  std::operator+(&local_78,"/sys/bus/pci/devices/",pci_addr);
  std::operator+(&local_58,&local_78,"/driver/unbind");
  std::filesystem::__cxx11::path::path((path *)local_38,&local_58,auto_format);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ofstream *)&local_288,(path *)local_38,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)&local_288 + *(long *)(local_288 + -0x18)));
  if ((bVar1 & 1) == 0) {
    lVar2 = std::__cxx11::string::c_str();
    std::__cxx11::string::length();
    std::ostream::write((char *)&local_288,lVar2);
    bVar1 = std::ios::operator!((ios *)((long)&local_288 + *(long *)(local_288 + -0x18)));
    if ((bVar1 & 1) != 0) {
      local_2b0.list.second = (char *)operator<<("failed to unload driver for device");
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp"
                 ,0x18,"remove_driver",&local_2b0);
    }
    std::ofstream::close();
    local_2a0 = 0;
  }
  else {
    local_299 = 0;
    local_298.list.second = (char *)operator<<("no driver loaded");
    debug<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp",
               0x13,"remove_driver",&local_298);
    local_2a0 = 1;
  }
  std::ofstream::~ofstream(&local_288);
  std::filesystem::__cxx11::path::~path((path *)local_38);
  return;
}

Assistant:

void remove_driver(const std::string &pci_addr) {
    fs::path path{"/sys/bus/pci/devices/" + pci_addr + "/driver/unbind"};
    auto s = std::ofstream(path, std::ofstream::out);
    if (!s) {
        debug("no driver loaded");
        return;
    }
    s.write(pci_addr.c_str(), pci_addr.length());
    if (!s) {
        error("failed to unload driver for device");
    }
    s.close();
}